

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restarts.cc
# Opt level: O0

void __thiscall
gss::LubyRestartsSchedule::LubyRestartsSchedule
          (LubyRestartsSchedule *this,LubyRestartsSchedule *other)

{
  const_iterator __i;
  list<long_long,_std::allocator<long_long>_> *in_RSI;
  _List_const_iterator<long_long> in_RDI;
  _List_node_base **this_00;
  _List_const_iterator<long_long> __first;
  size_t __n;
  iterator local_28 [2];
  list<long_long,_std::allocator<long_long>_> *in_stack_ffffffffffffffe8;
  
  RestartsSchedule::RestartsSchedule((RestartsSchedule *)in_RDI._M_node);
  (in_RDI._M_node)->_M_next = (_List_node_base *)&PTR__LubyRestartsSchedule_001fb7a8;
  (in_RDI._M_node)->_M_prev =
       (in_RSI->super__List_base<long_long,_std::allocator<long_long>_>)._M_impl._M_node.
       super__List_node_base._M_prev;
  __first._M_node = in_RDI._M_node + 1;
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::list(in_RSI,in_stack_ffffffffffffffe8);
  this_00 = &in_RDI._M_node[2]._M_prev;
  local_28[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<long_long,_std::allocator<long_long>_>::begin
                 ((list<long_long,_std::allocator<long_long>_> *)this_00);
  std::_List_const_iterator<long_long>::_List_const_iterator
            ((_List_const_iterator<long_long> *)this_00,local_28);
  __i = std::__cxx11::list<long_long,_std::allocator<long_long>_>::begin
                  ((list<long_long,_std::allocator<long_long>_> *)this_00);
  __n = in_RSI[1].super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node._M_size;
  std::distance<std::_List_const_iterator<long_long>>(__first,in_RDI);
  std::advance<std::_List_const_iterator<long_long>,long>
            ((_List_const_iterator<long_long> *)__i._M_node,__n);
  return;
}

Assistant:

LubyRestartsSchedule::LubyRestartsSchedule(const LubyRestartsSchedule & other) :
    _backtracks_remaining(other._backtracks_remaining),
    _sequence(other._sequence),
    _current_sequence(_sequence.begin())
{
    advance(_current_sequence, distance(other._sequence.begin(), other._current_sequence));
}